

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O0

int32 mgau_dump(mgau_model_t *g,int32 type)

{
  undefined1 local_68 [8];
  mgau_t m;
  char *tmpstr;
  int32 i;
  int32 c;
  int32 d;
  int32 type_local;
  mgau_model_t *g_local;
  
  if (g == (mgau_model_t *)0x0) {
    __assert_fail("g != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d3,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  if (g->mgau == (mgau_t *)0x0) {
    __assert_fail("g->mgau != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d4,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  if (g->mgau->mean == (float32 **)0x0) {
    __assert_fail("g->mgau[0].mean != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d5,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  if (g->mgau->var == (float32 **)0x0) {
    __assert_fail("g->mgau[0].var != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d6,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  if ((type != 2) && (type != 1)) {
    __assert_fail("type == MGAU_VAR || type == MGAU_MEAN",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x1d7,"int32 mgau_dump(mgau_model_t *, int32)");
  }
  m.mixw_f = (float32 *)
             __ckd_calloc__((long)(g->veclen * 0x14),1,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                            ,0x1d8);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
          ,0x1da,"\n");
  if (type == 1) {
    for (i = 0; i < g->n_mgau; i = i + 1) {
      memcpy(local_68,g->mgau + i,0x40);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x1df,"Mean of %d\n",(ulong)(uint)i);
      for (tmpstr._4_4_ = 0; (int)tmpstr._4_4_ < g->mgau[i].n_comp; tmpstr._4_4_ = tmpstr._4_4_ + 1)
      {
        sprintf((char *)m.mixw_f,"Component %d",(ulong)tmpstr._4_4_);
        for (tmpstr._0_4_ = 0; (int)tmpstr < g->veclen; tmpstr._0_4_ = (int)tmpstr + 1) {
          sprintf((char *)m.mixw_f,"%s %f",
                  (double)*(float *)(*(long *)(m._8_8_ + (long)(int)tmpstr._4_4_ * 8) +
                                    (long)(int)tmpstr * 4),m.mixw_f);
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,0x1e6,"%s\n",m.mixw_f);
      }
    }
  }
  if (type == 2) {
    for (i = 0; i < g->n_mgau; i = i + 1) {
      memcpy(local_68,g->mgau + i,0x40);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x1ed,"Variance of %d\n",(ulong)(uint)i);
      for (tmpstr._4_4_ = 0; (int)tmpstr._4_4_ < g->mgau[i].n_comp; tmpstr._4_4_ = tmpstr._4_4_ + 1)
      {
        sprintf((char *)m.mixw_f,"Component %d\n",(ulong)tmpstr._4_4_);
        for (tmpstr._0_4_ = 0; (int)tmpstr < g->veclen; tmpstr._0_4_ = (int)tmpstr + 1) {
          sprintf((char *)m.mixw_f,"%s %f",(double)(float)m.mean[(int)tmpstr._4_4_][(int)tmpstr],
                  m.mixw_f);
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,500,"%s\n",m.mixw_f);
      }
    }
  }
  ckd_free(m.mixw_f);
  return 0;
}

Assistant:

int32
mgau_dump(mgau_model_t * g, int32 type)
{
    int32 d, c, i;
    char *tmpstr;
    mgau_t m;
    assert(g != NULL);
    assert(g->mgau != NULL);
    assert(g->mgau[0].mean != NULL);
    assert(g->mgau[0].var != NULL);
    assert(type == MGAU_VAR || type == MGAU_MEAN);
    tmpstr = ckd_calloc((mgau_veclen(g) * 20), sizeof(char));

    E_INFO("\n");

    if (type == MGAU_MEAN) {
        for (d = 0; d < mgau_n_mgau(g); d++) {
            m = g->mgau[d];
            E_INFO("Mean of %d\n", d);

            for (c = 0; c < mgau_n_comp(g, d); c++) {
                sprintf(tmpstr, "Component %d", c);
                for (i = 0; i < mgau_veclen(g); i++) {
                    sprintf(tmpstr, "%s %f", tmpstr, m.mean[c][i]);
                }
                E_INFO("%s\n", tmpstr);
            }
        }
    }
    if (type == MGAU_VAR) {
        for (d = 0; d < mgau_n_mgau(g); d++) {
            m = g->mgau[d];
            E_INFO("Variance of %d\n", d);

            for (c = 0; c < mgau_n_comp(g, d); c++) {
                sprintf(tmpstr, "Component %d\n", c);
                for (i = 0; i < mgau_veclen(g); i++) {
                    sprintf(tmpstr, "%s %f", tmpstr, m.var[c][i]);
                }
                E_INFO("%s\n", tmpstr);
            }
        }
    }

    ckd_free(tmpstr);
    return 0;
}